

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_3udex Internal_StretchSlantWeightDex(uint max_stretch_dex,uint max_weight_dex,ON_Font *f)

{
  Stretch SVar1;
  Weight WVar2;
  uint kValue;
  uint jValue;
  uint iValue;
  ON_3udex local_10;
  
  if (f != (ON_Font *)0x0) {
    SVar1 = f->m_font_stretch;
    iValue = (uint)SVar1;
    if (SVar1 < max_stretch_dex && SVar1 != Unset) {
      WVar2 = f->m_font_weight;
      kValue = (uint)WVar2;
      if (WVar2 < max_weight_dex && WVar2 != Unset) {
        jValue = (uint)((f->m_font_style & ~Upright) == Italic);
        goto LAB_00483c15;
      }
    }
  }
  iValue = 0xffffffff;
  jValue = 0xffffffff;
  kValue = 0xffffffff;
LAB_00483c15:
  ON_3udex::ON_3udex(&local_10,iValue,jValue,kValue);
  return local_10;
}

Assistant:

ON_3udex Internal_StretchSlantWeightDex(unsigned max_stretch_dex, unsigned max_weight_dex, const ON_Font* f)
{
  for (;;)
  {
    if (nullptr == f)
      break;
    const unsigned stretch_dex = static_cast<unsigned char>(f->FontStretch());
    if (stretch_dex < 1 || stretch_dex >= max_stretch_dex)
      break;
    const unsigned slant_dex = (ON_Font::Style::Italic == f->FontStyle() || ON_Font::Style::Oblique == f->FontStyle())
      ? 1U
      : 0U;
    const unsigned weight_dex = static_cast<unsigned char>(f->FontWeight());
    if (weight_dex < 1 || weight_dex >= max_weight_dex)
      break;
    return ON_3udex(stretch_dex, slant_dex, weight_dex);
  }
  return ON_3udex(ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX);
}